

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

ImageFeatureType_ImageSize *
google::protobuf::internal::GenericTypeHandler<CoreML::Specification::ImageFeatureType_ImageSize>::
New(Arena *arena)

{
  Arena *arena_local;
  ImageFeatureType_ImageSize *local_28;
  ImageFeatureType_ImageSize *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (ImageFeatureType_ImageSize *)operator_new(0x28);
    CoreML::Specification::ImageFeatureType_ImageSize::ImageFeatureType_ImageSize(local_28);
  }
  else {
    local_28 = (ImageFeatureType_ImageSize *)
               Arena::AllocateAligned
                         (arena,(type_info *)
                                &CoreML::Specification::ImageFeatureType_ImageSize::typeinfo,0x28);
    CoreML::Specification::ImageFeatureType_ImageSize::ImageFeatureType_ImageSize(local_28);
    Arena::AddListNode(arena,local_28,
                       arena_destruct_object<CoreML::Specification::ImageFeatureType_ImageSize>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }